

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O2

void CVmPack::unpack_iter_item
               (CVmPackPos *p,CVmObjList *retlst,int *retcnt,CVmPackGroup *group,int *prefix_count)

{
  CVmDataSource *src;
  int iVar1;
  int iVar2;
  int iVar3;
  wchar_t wVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  _func_int *UNRECOVERED_JUMPTABLE;
  undefined4 extraout_var_03;
  int iVar5;
  long lVar6;
  bool bVar7;
  CVmPackType t;
  CVmPackPos p_1;
  
  t.lit.idx = 0;
  t.lit.p.p_ = (char *)0x0;
  t.lit.len = 0;
  t.type_code = L'\0';
  t.big_endian = 0;
  t.count = -1;
  t.count_in_bytes = 0;
  t.count_as_type = L'\0';
  t.up_to_count = 0;
  t.bang = 0;
  t.tilde = 0;
  t.pct = 0;
  t.qu = 0;
  t.null_term = 0;
  t.fmtidx = 0;
  parse_type(p,&t,group);
  src = group->ds;
  bVar7 = true;
  switch(t.type_code) {
  case L'u':
  case L'w':
switchD_00269e6a_caseD_75:
    bVar7 = false;
    break;
  case L'v':
  case L'y':
  case L'z':
    break;
  case L'x':
    if (t.bang != 0) {
      iVar1 = alignment_padding(&t,group,1);
      lVar6 = (long)iVar1;
      UNRECOVERED_JUMPTABLE = src->_vptr_CVmDataSource[8];
      goto LAB_0026a0d3;
    }
    iVar1 = t.count;
    if (t.count < 0) {
      iVar1 = 1;
    }
LAB_0026a093:
    UNRECOVERED_JUMPTABLE = src->_vptr_CVmDataSource[8];
LAB_0026a09d:
    lVar6 = (long)iVar1;
LAB_0026a0d3:
    (*UNRECOVERED_JUMPTABLE)(src,lVar6,1);
    return;
  case L'{':
    p_1.p = t.lit.p;
    p_1.len = t.lit.len;
    p_1.idx = t.lit.idx;
    iVar1 = 0;
    while (iVar2 = CVmPackPos::more(&p_1), iVar2 != 0) {
      iVar1 = iVar1 + 1;
      CVmPackPos::inc(&p_1);
      CVmPackPos::inc(&p_1);
    }
LAB_00269fcc:
    iVar2 = t.count;
    if (t.count < 0) {
      iVar2 = 1;
    }
    (*src->_vptr_CVmDataSource[8])(src,(long)(iVar2 * iVar1));
    return;
  default:
    if ((uint)(t.type_code + L'\xffffff9f') < 2) goto switchD_00269e6a_caseD_75;
    if (t.type_code == L'\"') {
      p_1.p = t.lit.p;
      p_1.len = t.lit.len;
      p_1.idx = t.lit.idx;
      iVar1 = 0;
      while (p_1.len != 0) {
        wVar4 = CVmPackPos::getch_raw(&p_1);
        if (wVar4 == L'\"') {
          CVmPackPos::inc(&p_1);
        }
        CVmPackPos::inc(&p_1);
        iVar1 = iVar1 + 1;
      }
      goto LAB_00269fcc;
    }
    if (t.type_code != L'@') {
      if ((((t.type_code != L'A') && (t.type_code != L'H')) && (t.type_code != L'U')) &&
         (t.type_code != L'W')) {
        if (t.type_code == L'X') {
          if (t.bang == 0) {
            iVar1 = t.count;
            if (t.count < 0) {
              iVar1 = 1;
            }
            iVar1 = -iVar1;
            goto LAB_0026a093;
          }
          iVar1 = alignment_padding(&t,group,-1);
          UNRECOVERED_JUMPTABLE = src->_vptr_CVmDataSource[8];
          goto LAB_0026a09d;
        }
        if (t.type_code != L'h') break;
      }
      goto switchD_00269e6a_caseD_75;
    }
    if (t.qu == 0) {
      if (t.bang == 0) {
        lVar6 = group->stream_ofs;
      }
      else {
        lVar6 = CVmPackGroup::root_stream_ofs(group);
      }
      iVar1 = t.count;
      if (t.count < 0) {
        iVar1 = 1;
      }
      iVar2 = (*src->_vptr_CVmDataSource[7])(src);
      lVar6 = (iVar1 + lVar6) - CONCAT44(extraout_var_03,iVar2);
      UNRECOVERED_JUMPTABLE = src->_vptr_CVmDataSource[8];
      goto LAB_0026a0d3;
    }
    goto LAB_00269ff4;
  }
  if (prefix_count != (int *)0x0) {
    t.count = *prefix_count;
  }
  iVar1 = t.count;
  if (bVar7) {
    if (t.count == -2) {
      iVar1 = (*src->_vptr_CVmDataSource[6])(src);
      while (iVar2 = (*src->_vptr_CVmDataSource[7])(src),
            CONCAT44(extraout_var_00,iVar2) < CONCAT44(extraout_var,iVar1)) {
        unpack_into_list(retlst,retcnt,src,&t,group);
      }
    }
    else if (t.up_to_count == 0) {
      iVar1 = 0;
      if (0 < t.count) {
        iVar1 = t.count;
      }
      iVar2 = 1;
      if (-1 < t.count) {
        iVar2 = iVar1;
      }
      while (iVar2 != 0) {
        unpack_into_list(retlst,retcnt,src,&t,group);
        iVar2 = iVar2 + -1;
      }
    }
    else {
      iVar3 = (*src->_vptr_CVmDataSource[6])(src);
      iVar2 = 0;
      if (0 < iVar1) {
        iVar2 = iVar1;
      }
      iVar5 = 1;
      if (-1 < iVar1) {
        iVar5 = iVar2;
      }
      while ((bVar7 = iVar5 != 0, iVar5 = iVar5 + -1, bVar7 &&
             (iVar1 = (*src->_vptr_CVmDataSource[7])(src),
             CONCAT44(extraout_var_02,iVar1) < CONCAT44(extraout_var_01,iVar3)))) {
        unpack_into_list(retlst,retcnt,src,&t,group);
      }
    }
  }
  else {
LAB_00269ff4:
    unpack_into_list(retlst,retcnt,src,&t,group);
  }
  return;
}

Assistant:

void CVmPack::unpack_iter_item(VMG_ CVmPackPos *p,
                               CVmObjList *retlst, int &retcnt,
                               CVmPackGroup *group, const int *prefix_count)
{
    int len;
    
    /* parse the template item */
    CVmPackType t;
    parse_type(p, &t, group);

    /* get the data source */
    CVmDataSource *src = group->ds;

    /* check for non-value types and string types */
    int is_string_type = FALSE;
    switch (t.type_code)
    {
    case 'x':
        /* Nul bytes: on input, just skip bytes */
        if (t.bang)
            src->seek(alignment_padding(&t, group, 1), OSFSK_CUR);
        else
            src->seek(t.get_count(), OSFSK_CUR);
        return;

    case 'X':
        /* back up by 'count' bytes */
        if (t.bang)
            src->seek(alignment_padding(&t, group, -1), OSFSK_CUR);
        else
            src->seek(-t.get_count(), OSFSK_CUR);
        return;

    case '"':
        /* count the characters in the string */
        len = 0;
        for (CVmPackPos p(&t.lit) ; p.len != 0 ; p.inc(), ++len)
        {
            /* if this is a quote, it must be stuttered, so skip it */
            if (p.getch_raw() == '"')
                p.inc();
        }

        /* skip the bytes, and we're done */
        src->seek(len * t.get_count(), OSFSK_CUR);
        return;

    case '{':
        /* count the hex digit pairs */
        len = 0;
        for (CVmPackPos p(&t.lit) ; p.more() ; ++len, p.inc(), p.inc()) ;

        /* skip the bytes, and we're done */
        src->seek(len * t.get_count(), OSFSK_CUR);
        return;

    case '@':
        /* seek to position or retrieve current position */
        if (t.qu)
        {
            /* @? retrieves the current position as an output value */
            unpack_into_list(vmg_ retlst, retcnt, src, &t, group);
        }
        else
        {
            /* 
             *   Absolute positioning: seek to the starting position plus the
             *   specified offset.  The starting position is the current
             *   group's starting position, or the whole string's start if
             *   the !  qualifier is present.  
             */
            src->seek((t.bang ? group->root_stream_ofs() : group->stream_ofs)
                      + t.get_count() - src->get_pos(),
                      OSFSK_CUR);
        }
        return;

    case 'a':
    case 'A':
    case 'b':
    case 'u':
    case 'U':
    case 'w':
    case 'W':
    case 'h':
    case 'H':
        /* make a note that this is a string type */
        is_string_type = TRUE;
        break;
    }

    /*
     *   We have a regular unpacking type (not one of the special positioning
     *   codes).  If there's a prefix count, it overrides any count specified
     *   in the type.  
     */
    if (prefix_count != 0)
        t.count = *prefix_count;

    /* 
     *   If it's a string type, the repeat count specifies the length of the
     *   string in the file (in bytes, characters, nibbles, or other units
     *   that vary by template type).  Otherwise, the repeat count is the
     *   number of copies of the item to unpack.  
     */
    if (is_string_type)
    {
        /* 
         *   It's a string type.  The count doesn't specify the number of
         *   strings to write, but rather specifies the number of bytes to
         *   read into one string.  
         */
        unpack_into_list(vmg_ retlst, retcnt, src, &t, group);
    }
    else if (t.count == ITER_STAR)
    {
        /* unpack this item repeatedly until we run out of source */
        long src_size = src->get_size();
        while (src->get_pos() < src_size)
            unpack_into_list(vmg_ retlst, retcnt, src, &t, group);
    }
    else if (t.up_to_count)
    {
        /* 
         *   unpack this item the number of times given by the repeat count,
         *   but stop if we reach EOF first
         */
        long src_size = src->get_size();
        for (int i = 0 ; i < t.get_count() && src->get_pos() < src_size ; ++i)
            unpack_into_list(vmg_ retlst, retcnt, src, &t, group);
    }
    else
    {
        /* unpack this item the number of times given by the repeat count */
        for (int i = 0 ; i < t.get_count() ; ++i)
            unpack_into_list(vmg_ retlst, retcnt, src, &t, group);
    }
}